

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigWnd.c
# Opt level: O2

Aig_Obj_t * Saig_ManFindPivot(Aig_Man_t *p)

{
  Aig_Obj_t *pAVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  
  iVar2 = p->nRegs;
  if (iVar2 < 1) {
    if (p->nObjs[6] + p->nObjs[5] < 2) {
      __assert_fail("Aig_ManNodeNum(p) > 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigWnd.c"
                    ,0x1bc,"Aig_Obj_t *Saig_ManFindPivot(Aig_Man_t *)");
    }
    iVar3 = 0;
    for (iVar2 = 0; iVar2 < p->vObjs->nSize; iVar2 = iVar2 + 1) {
      pAVar1 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,iVar2);
      if ((pAVar1 != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pAVar1->field_0x18 & 7) - 7)) {
        if (iVar3 == (p->nObjs[6] + p->nObjs[5]) / 2) {
          return pAVar1;
        }
        iVar3 = iVar3 + 1;
      }
    }
    pAVar1 = (Aig_Obj_t *)0x0;
  }
  else {
    if (iVar2 == 1) {
      pAVar1 = Saig_ManLo(p,0);
      return pAVar1;
    }
    iVar3 = 0;
    do {
      if (iVar2 <= iVar3) {
        return (Aig_Obj_t *)0x0;
      }
      pAVar1 = (Aig_Obj_t *)Vec_PtrEntry(p->vCis,p->nTruePis + iVar3);
      iVar2 = p->nRegs;
      bVar4 = iVar3 != iVar2 / 2;
      iVar3 = iVar3 + 1;
    } while (bVar4);
  }
  return pAVar1;
}

Assistant:

Aig_Obj_t * Saig_ManFindPivot( Aig_Man_t * p )
{
    Aig_Obj_t * pObj;
    int i, Counter;
    if ( Aig_ManRegNum(p) > 0 )
    {
        if ( Aig_ManRegNum(p) == 1 )
            return Saig_ManLo( p, 0 );
        Saig_ManForEachLo( p, pObj, i )
        {
            if ( i == Aig_ManRegNum(p)/2 )
                return pObj;
        }
    }
    else
    {
        Counter = 0;
        assert( Aig_ManNodeNum(p) > 1 );
        Aig_ManForEachNode( p, pObj, i )
        {
            if ( Counter++ == Aig_ManNodeNum(p)/2 )
                return pObj;
        }
    }
    return NULL;
}